

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pelelm_prob.cpp
# Opt level: O0

void amrex_probinit(int *param_1,int *param_2,int *param_3,amrex_real *param_4,amrex_real *param_5)

{
  PmfData *in_stack_00000008;
  ParmParse pp;
  string *in_stack_ffffffffffffff48;
  ParmParse *in_stack_ffffffffffffff50;
  allocator local_a1;
  string local_a0 [92];
  int in_stack_ffffffffffffffbc;
  double *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  ParmParse *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"prob",&local_a1);
  amrex::ParmParse::ParmParse(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  pele::physics::PMF::PmfData::initialize(in_stack_00000008);
  amrex::ParmParse::~ParmParse((ParmParse *)0x1223d8);
  return;
}

Assistant:

void amrex_probinit (const int* /*init*/,
                         const int* /*name*/,
                         const int* /*namelen*/,
                         const amrex_real* /*problo*/,
                         const amrex_real* /*probhi*/)
    {
        amrex::ParmParse pp("prob");

        pp.query("P_mean",   PeleLM::prob_parm->P_mean);
        pp.query("standoff", PeleLM::prob_parm->standoff);
        pp.query("pertmag",  PeleLM::prob_parm->pertmag);

        PeleLM::pmf_data.initialize();
    }